

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_frame.c
# Opt level: O3

int dwarf_get_fde_for_die
              (Dwarf_Debug dbg,Dwarf_Die die,Dwarf_Fde_conflict *ret_fde,Dwarf_Error *error)

{
  Dwarf_Small *pDVar1;
  Dwarf_Unsigned DVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  char *msg;
  Dwarf_Signed errval;
  Dwarf_Half address_size;
  Dwarf_Fde_conflict local_100;
  Dwarf_Attribute attr;
  Dwarf_Small *local_f0;
  Dwarf_Small *local_e8;
  Dwarf_Signed signdval;
  Dwarf_Signed local_d8;
  Dwarf_Cie_conflict new_cie;
  cie_fde_prefix_s prefix_c;
  cie_fde_prefix_s prefix;
  
  signdval = 0;
  local_100 = (Dwarf_Fde_conflict)0x0;
  address_size = 0;
  if ((dbg == (Dwarf_Debug)0x0) || (dbg->de_magic != 0xebfdebfd)) {
    msg = 
    "DW_DLE_DBG_NULL: dbg argument to dwarf_get_fde_for_die()either null or it containsa stale Dwarf_Debug pointer"
    ;
    errval = 0x51;
  }
  else {
    if (die != (Dwarf_Die)0x0) {
      iVar4 = dwarf_attr(die,0x2001,&attr,error);
      if (iVar4 != 0) {
        return iVar4;
      }
      iVar4 = dwarf_formsdata(attr,&signdval,error);
      if (iVar4 != 0) {
        dwarf_dealloc_attribute(attr);
        return iVar4;
      }
      iVar4 = dwarf_get_die_address_size(die,&address_size,error);
      dwarf_dealloc_attribute(attr);
      if (iVar4 != 0) {
        return iVar4;
      }
      iVar4 = _dwarf_load_section(dbg,&dbg->de_debug_frame,error);
      if (iVar4 != 0) {
        return iVar4;
      }
      local_d8 = signdval;
      pDVar1 = (dbg->de_debug_frame).dss_data;
      DVar2 = (dbg->de_debug_frame).dss_size;
      iVar4 = _dwarf_validate_register_numbers(dbg,error);
      if (iVar4 != 0) {
        return 1;
      }
      prefix_c.cf_section_ptr = (Dwarf_Small *)0x0;
      prefix_c.cf_section_index = 0;
      prefix_c.cf_cie_id = 0;
      prefix_c.cf_cie_id_addr = (Dwarf_Small *)0x0;
      prefix_c.cf_length = 0;
      prefix_c.cf_local_length_size = 0;
      prefix_c.cf_local_extension_size = 0;
      prefix_c.cf_start_addr = (Dwarf_Small *)0x0;
      prefix_c.cf_addr_after_prefix = (Dwarf_Small *)0x0;
      prefix_c.cf_section_length = 0;
      prefix.cf_start_addr = (Dwarf_Small *)0x0;
      prefix.cf_addr_after_prefix = (Dwarf_Small *)0x0;
      prefix.cf_length = 0;
      prefix.cf_local_length_size = 0;
      prefix.cf_local_extension_size = 0;
      prefix.cf_cie_id = 0;
      prefix.cf_cie_id_addr = (Dwarf_Small *)0x0;
      prefix.cf_section_ptr = (Dwarf_Small *)0x0;
      prefix.cf_section_index = 0;
      prefix.cf_section_length = 0;
      local_f0 = pDVar1 + DVar2;
      local_e8 = pDVar1;
      iVar4 = _dwarf_read_cie_fde_prefix
                        (dbg,pDVar1 + local_d8,(dbg->de_debug_frame).dss_data,
                         (dbg->de_debug_frame).dss_index,(dbg->de_debug_frame).dss_size,&prefix,
                         error);
      DVar2 = prefix.cf_cie_id;
      if (iVar4 == -1) {
        return -1;
      }
      if (iVar4 == 1) {
        return 1;
      }
      uVar3 = (dbg->de_debug_frame).dss_size;
      if (prefix.cf_cie_id < uVar3) {
        iVar4 = _dwarf_create_fde_from_after_start
                          (dbg,&prefix,local_e8,uVar3,prefix.cf_addr_after_prefix,local_f0,0,
                           (Dwarf_Cie_conflict)0x0,address_size,&local_100,error);
        if (iVar4 == -1) {
          return -1;
        }
        if (iVar4 == 1) {
          return 1;
        }
        local_100->fd_fde_owns_cie = 1;
        uVar3 = (dbg->de_debug_frame).dss_size;
        if (uVar3 <= DVar2) goto LAB_001a2bd1;
        if (((long)DVar2 < 0) || (local_100->fd_section_ptr + DVar2 < DVar2)) {
          dwarf_dealloc(dbg,local_100,0x15);
          local_100 = (Dwarf_Fde_conflict)0x0;
          goto LAB_001a2bd1;
        }
        iVar4 = _dwarf_read_cie_fde_prefix
                          (dbg,local_100->fd_section_ptr + DVar2,(dbg->de_debug_frame).dss_data,
                           (dbg->de_debug_frame).dss_index,uVar3,&prefix_c,error);
        if (iVar4 == -1) {
          dwarf_dealloc(dbg,local_100,0x15);
          return -1;
        }
        if (iVar4 == 1) {
          dwarf_dealloc(dbg,local_100,0x15);
          return 1;
        }
        if (prefix_c.cf_cie_id == 0xffffffffffffffff) {
          new_cie = (Dwarf_Cie_conflict)0x0;
          iVar5 = _dwarf_create_cie_from_after_start
                            (dbg,&prefix_c,local_e8,prefix_c.cf_addr_after_prefix,local_f0,0,0,
                             &new_cie,error);
          if (iVar5 == 0) {
            local_100->fd_cie = new_cie;
            *ret_fde = local_100;
            return 0;
          }
          dwarf_dealloc(dbg,local_100,0x15);
          return iVar4;
        }
        dwarf_dealloc(dbg,local_100,0x15);
        local_100 = (Dwarf_Fde_conflict)0x0;
        msg = "DW_DLE_NO_CIE_FOR_FDE: The CIE id is not a true cid id. Corrupt DWARF.";
      }
      else {
LAB_001a2bd1:
        msg = 
        "DW_DLE_NO_CIE_FOR_FDE: dwarf_get_fde_for_die fails as the CIE id offset is impossibly large"
        ;
      }
      errval = 0x96;
      goto LAB_001a298e;
    }
    msg = "DW_DLE_DIE_NUL: in dwarf_get_fde_for_die(): Called with Dwarf_Die argument null";
    errval = 0x34;
  }
  dbg = (Dwarf_Debug)0x0;
LAB_001a298e:
  _dwarf_error_string(dbg,error,errval,msg);
  return 1;
}

Assistant:

int
dwarf_get_fde_for_die(Dwarf_Debug dbg,
    Dwarf_Die die,
    Dwarf_Fde * ret_fde, Dwarf_Error * error)
{
    Dwarf_Attribute attr;
    Dwarf_Unsigned fde_offset = 0;
    Dwarf_Signed signdval = 0;
    Dwarf_Fde new_fde = 0;
    unsigned char *fde_ptr = 0;
    unsigned char *fde_start_ptr = 0;
    unsigned char *fde_end_ptr = 0;
    unsigned char *cie_ptr = 0;
    Dwarf_Unsigned cie_id = 0;
    Dwarf_Half     address_size = 0;

    /* Fields for the current Cie being read. */
    int res = 0;
    int resattr = 0;
    int sdatares = 0;

    struct cie_fde_prefix_s prefix;
    struct cie_fde_prefix_s prefix_c;

    CHECK_DBG(dbg,error,"dwarf_get_fde_for_die()");
    if (!die ) {
        _dwarf_error_string(NULL, error, DW_DLE_DIE_NULL,
            "DW_DLE_DIE_NUL: in dwarf_get_fde_for_die(): "
            "Called with Dwarf_Die argument null");
        return DW_DLV_ERROR;
    }
    resattr = dwarf_attr(die, DW_AT_MIPS_fde, &attr, error);
    if (resattr != DW_DLV_OK) {
        return resattr;
    }
    /* why is this formsdata? FIX */
    sdatares = dwarf_formsdata(attr, &signdval, error);
    if (sdatares != DW_DLV_OK) {
        dwarf_dealloc_attribute(attr);
        return sdatares;
    }
    res = dwarf_get_die_address_size(die,&address_size,error);
    if (res != DW_DLV_OK) {
        dwarf_dealloc_attribute(attr);
        return res;
    }
    dwarf_dealloc_attribute(attr);
    res = _dwarf_load_section(dbg, &dbg->de_debug_frame,error);
    if (res != DW_DLV_OK) {
        return res;
    }
    fde_offset = signdval;
    fde_start_ptr = dbg->de_debug_frame.dss_data;
    fde_ptr = fde_start_ptr + fde_offset;
    fde_end_ptr = fde_start_ptr + dbg->de_debug_frame.dss_size;
    res = _dwarf_validate_register_numbers(dbg,error);
    if (res == DW_DLV_ERROR) {
        return res;
    }

    /*  First read in the 'common prefix' to figure out
        what we are to do with this entry. */
    memset(&prefix_c, 0, sizeof(prefix_c));
    memset(&prefix, 0, sizeof(prefix));
    res = _dwarf_read_cie_fde_prefix(dbg, fde_ptr,
        dbg->de_debug_frame.dss_data,
        dbg->de_debug_frame.dss_index,
        dbg->de_debug_frame.dss_size,
        &prefix,
        error);
    if (res == DW_DLV_ERROR) {
        return res;
    }
    if (res == DW_DLV_NO_ENTRY) {
        return res;
    }
    fde_ptr = prefix.cf_addr_after_prefix;
    cie_id = prefix.cf_cie_id;
    if (cie_id  >=  dbg->de_debug_frame.dss_size ) {
        _dwarf_error_string(dbg, error, DW_DLE_NO_CIE_FOR_FDE,
            "DW_DLE_NO_CIE_FOR_FDE: "
            "dwarf_get_fde_for_die fails as the CIE id "
            "offset is impossibly large");
        return DW_DLV_ERROR;
    }
    /*  Pass NULL, not section pointer, for 3rd argument.
        de_debug_frame.dss_data has no eh_frame relevance. */
    res = _dwarf_create_fde_from_after_start(dbg, &prefix,
        fde_start_ptr,
        dbg->de_debug_frame.dss_size,
        fde_ptr,
        fde_end_ptr,
        /* use_gnu_cie_calc= */ 0,
        /* Dwarf_Cie = */ 0,
        address_size,
        &new_fde, error);
    if (res == DW_DLV_ERROR) {
        return res;
    }
    if (res == DW_DLV_NO_ENTRY) {
        return res;
    }
    /* DW_DLV_OK */

    /*  This is the only situation this is set.
        and is really dangerous. as fde and cie
        are set for dealloc by dwarf_finish(). */
    new_fde->fd_fde_owns_cie = TRUE;
    /*  Now read the cie corresponding to the fde,
        _dwarf_read_cie_fde_prefix checks
        cie_ptr for being within the section. */
    if (cie_id  >=  dbg->de_debug_frame.dss_size ) {
        _dwarf_error_string(dbg, error, DW_DLE_NO_CIE_FOR_FDE,
            "DW_DLE_NO_CIE_FOR_FDE: "
            "dwarf_get_fde_for_die fails as the CIE id "
            "offset is impossibly large");
        return DW_DLV_ERROR;
    }
    cie_ptr = new_fde->fd_section_ptr + cie_id;
    if ((Dwarf_Unsigned)(uintptr_t)cie_ptr  <
        (Dwarf_Unsigned)(uintptr_t)new_fde->fd_section_ptr ||
        (Dwarf_Unsigned)(uintptr_t)cie_ptr <  cie_id) {
        dwarf_dealloc(dbg,new_fde,DW_DLA_FDE);
        new_fde = 0;
        _dwarf_error_string(dbg, error, DW_DLE_NO_CIE_FOR_FDE,
            "DW_DLE_NO_CIE_FOR_FDE: "
            "dwarf_get_fde_for_die fails as the CIE id "
            "offset is impossibly large");
        return DW_DLV_ERROR;
    }
    res = _dwarf_read_cie_fde_prefix(dbg, cie_ptr,
        dbg->de_debug_frame.dss_data,
        dbg->de_debug_frame.dss_index,
        dbg->de_debug_frame.dss_size,
        &prefix_c, error);
    if (res == DW_DLV_ERROR) {
        dwarf_dealloc(dbg,new_fde,DW_DLA_FDE);
        new_fde = 0;
        return res;
    }
    if (res == DW_DLV_NO_ENTRY) {
        dwarf_dealloc(dbg,new_fde,DW_DLA_FDE);
        new_fde = 0;
        return res;
    }

    cie_ptr = prefix_c.cf_addr_after_prefix;
    cie_id = prefix_c.cf_cie_id;

    if (cie_id == (Dwarf_Unsigned)DW_CIE_ID) {
        int res2 = 0;
        Dwarf_Cie new_cie = 0;

        /*  Pass NULL, not section pointer, for 3rd argument.
            de_debug_frame.dss_data has no eh_frame relevance. */
        res2 = _dwarf_create_cie_from_after_start(dbg,
            &prefix_c,
            fde_start_ptr,
            cie_ptr,
            fde_end_ptr,
            /* cie_count= */ 0,
            /* use_gnu_cie_calc= */
            0, &new_cie, error);
        if (res2 != DW_DLV_OK) {
            dwarf_dealloc(dbg, new_fde, DW_DLA_FDE);
            return res;
        }
        new_fde->fd_cie = new_cie;
    } else {
        dwarf_dealloc(dbg,new_fde,DW_DLA_FDE);
        new_fde = 0;
        _dwarf_error_string(dbg, error, DW_DLE_NO_CIE_FOR_FDE,
            "DW_DLE_NO_CIE_FOR_FDE: "
            "The CIE id is not a true cid id. Corrupt DWARF.");
        return DW_DLV_ERROR;
    }
    *ret_fde = new_fde;
    return DW_DLV_OK;
}